

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.h
# Opt level: O1

_Bool roaring_bitmap_contains(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  bool bVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  
  iVar2 = (r->high_low_container).size;
  if ((long)iVar2 != 0) {
    puVar3 = (r->high_low_container).keys;
    uVar9 = (ushort)(val >> 0x10);
    if (puVar3[(long)iVar2 + -1] != uVar9) {
      uVar7 = iVar2 - 1;
      uVar10 = 0;
      uVar8 = uVar7;
      do {
        if ((int)uVar7 < (int)uVar10) {
          uVar6 = ~uVar10;
          break;
        }
        uVar6 = uVar10 + uVar7 >> 1;
        uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar10 + uVar7 & 0xfffffffe));
        if (uVar1 < uVar9) {
          uVar10 = uVar6 + 1;
          bVar4 = true;
          uVar6 = uVar8;
        }
        else if (uVar9 < uVar1) {
          uVar7 = uVar6 - 1;
          bVar4 = true;
          uVar6 = uVar8;
        }
        else {
          bVar4 = false;
        }
        uVar8 = uVar6;
      } while (bVar4);
      goto LAB_00129afb;
    }
  }
  uVar6 = iVar2 - 1;
LAB_00129afb:
  if ((int)uVar6 < 0) {
    return false;
  }
  _Var5 = container_contains((r->high_low_container).containers[uVar6 & 0xffff],(uint16_t)val,
                             (r->high_low_container).typecodes[uVar6 & 0xffff]);
  return _Var5;
}

Assistant:

inline int32_t ra_get_index(const roaring_array_t *ra, uint16_t x) {
    if ((ra->size == 0) || ra->keys[ra->size - 1] == x) return ra->size - 1;
    return binarySearch(ra->keys, (int32_t)ra->size, x);
}